

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O1

void Aig_RManSaveOne(Aig_RMan_t *p,uint *pTruth,int nVars)

{
  Aig_Man_t *p_00;
  int iVar1;
  Bdc_Fun_t *pBVar2;
  Aig_Obj_t *pAVar3;
  Bdc_Fun_t *pBVar4;
  void *pvVar5;
  Bdc_Fun_t *pBVar6;
  void *pvVar7;
  int iVar8;
  
  iVar1 = Bdc_ManDecompose(p->pBidec,pTruth,(uint *)0x0,nVars,(Vec_Ptr_t *)0x0,1000);
  if (iVar1 < 0) {
    puts("Decomposition failed.");
    return;
  }
  pBVar2 = Bdc_ManFunc(p->pBidec,0);
  Bdc_FuncSetCopy(pBVar2,p->pAig->pConst1);
  iVar1 = 0;
  if (0 < nVars) {
    do {
      iVar8 = iVar1 + 1;
      pBVar2 = Bdc_ManFunc(p->pBidec,iVar8);
      pAVar3 = Aig_IthVar(p->pAig,iVar1);
      Bdc_FuncSetCopy(pBVar2,pAVar3);
      iVar1 = iVar8;
    } while (nVars != iVar8);
  }
  iVar1 = Bdc_ManNodeNum(p->pBidec);
  iVar8 = nVars + 1;
  if (iVar8 < iVar1) {
    do {
      pBVar2 = Bdc_ManFunc(p->pBidec,iVar8);
      p_00 = p->pAig;
      pBVar4 = Bdc_FuncFanin0(pBVar2);
      pvVar5 = Bdc_FuncCopy((Bdc_Fun_t *)((ulong)pBVar4 & 0xfffffffffffffffe));
      pBVar6 = Bdc_FuncFanin1(pBVar2);
      pvVar7 = Bdc_FuncCopy((Bdc_Fun_t *)((ulong)pBVar6 & 0xfffffffffffffffe));
      pAVar3 = Aig_And(p_00,(Aig_Obj_t *)((ulong)((uint)pBVar4 & 1) ^ (ulong)pvVar5),
                       (Aig_Obj_t *)((ulong)((uint)pBVar6 & 1) ^ (ulong)pvVar7));
      Bdc_FuncSetCopy(pBVar2,pAVar3);
      iVar8 = iVar8 + 1;
    } while (iVar1 != iVar8);
  }
  pBVar2 = Bdc_ManRoot(p->pBidec);
  pvVar5 = Bdc_FuncCopy((Bdc_Fun_t *)((ulong)pBVar2 & 0xfffffffffffffffe));
  Aig_ObjCreateCo(p->pAig,(Aig_Obj_t *)((ulong)((uint)pBVar2 & 1) ^ (ulong)pvVar5));
  return;
}

Assistant:

void Aig_RManSaveOne( Aig_RMan_t * p, unsigned * pTruth, int nVars )
{
    int i, nNodes, RetValue;
    Bdc_Fun_t * pFunc;
    Aig_Obj_t * pTerm;
    // perform decomposition
    RetValue = Bdc_ManDecompose( p->pBidec, pTruth, NULL, nVars, NULL, 1000 );
    if ( RetValue < 0 )
    {
        printf( "Decomposition failed.\n" );
        return;
    }
    // convert back into HOP
    Bdc_FuncSetCopy( Bdc_ManFunc( p->pBidec, 0 ), Aig_ManConst1(p->pAig) );
    for ( i = 0; i < nVars; i++ )
        Bdc_FuncSetCopy( Bdc_ManFunc( p->pBidec, i+1 ), Aig_IthVar(p->pAig, i) );
    nNodes = Bdc_ManNodeNum(p->pBidec);
    for ( i = nVars + 1; i < nNodes; i++ )
    {
        pFunc = Bdc_ManFunc( p->pBidec, i );
        Bdc_FuncSetCopy( pFunc, Aig_And( p->pAig, 
            Bdc_FunCopyHop(Bdc_FuncFanin0(pFunc)), 
            Bdc_FunCopyHop(Bdc_FuncFanin1(pFunc)) ) );
    }
    pTerm = Bdc_FunCopyHop( Bdc_ManRoot(p->pBidec) );
    pTerm = Aig_ObjCreateCo( p->pAig, pTerm );
//    assert( pTerm->fPhase == 0 );
}